

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O1

VmConstant * LoadFrameStruct(InstructionVMEvalContext *ctx,Storage *storage,uint offset,VmType type)

{
  Allocator *pAVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  VmConstant *pVVar4;
  ulong uVar5;
  char *__s;
  undefined4 extraout_var_00;
  
  uVar5 = type._0_8_;
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])();
  __s = (char *)CONCAT44(extraout_var,iVar3);
  memset(__s,0,uVar5 >> 0x20);
  bVar2 = InstructionVMEvalContext::Storage::Reserve(storage,ctx,offset,type.size);
  if (bVar2) {
    memcpy(__s,(storage->data).data + offset,uVar5 >> 0x20);
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xd8);
    pVVar4 = (VmConstant *)CONCAT44(extraout_var_00,iVar3);
    pAVar1 = ctx->allocator;
    (pVVar4->super_VmValue).typeID = 1;
    (pVVar4->super_VmValue).type.type = (int)uVar5;
    (pVVar4->super_VmValue).type.size = (int)(uVar5 >> 0x20);
    (pVVar4->super_VmValue).type.structType = type.structType;
    (pVVar4->super_VmValue).source = (SynBase *)0x0;
    (pVVar4->super_VmValue).comment.begin = (char *)0x0;
    (pVVar4->super_VmValue).comment.end = (char *)0x0;
    (pVVar4->super_VmValue).users.allocator = pAVar1;
    (pVVar4->super_VmValue).users.data = (pVVar4->super_VmValue).users.little;
    (pVVar4->super_VmValue).users.count = 0;
    (pVVar4->super_VmValue).users.max = 8;
    (pVVar4->super_VmValue).hasSideEffects = false;
    (pVVar4->super_VmValue).hasMemoryAccess = false;
    (pVVar4->super_VmValue).canBeRemoved = true;
    (pVVar4->super_VmValue).hasKnownSimpleUse = false;
    (pVVar4->super_VmValue).hasKnownNonSimpleUse = false;
    (pVVar4->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmValue_003f8d38;
    pVVar4->iValue = 0;
    pVVar4->sValue = (char *)0x0;
    pVVar4->bValue = (VmBlock *)0x0;
    pVVar4->fValue = (VmFunction *)0x0;
    pVVar4->container = (VariableData *)0x0;
    pVVar4->dValue = 0.0;
    pVVar4->lValue = 0;
    pVVar4->isFloat = false;
    pVVar4->isReference = false;
    pVVar4->sValue = __s;
  }
  else {
    pVVar4 = (VmConstant *)0x0;
    anon_unknown.dwarf_255680::Report(ctx,"ERROR: out of stack space");
  }
  return pVVar4;
}

Assistant:

VmConstant* LoadFrameStruct(InstructionVMEvalContext &ctx, InstructionVMEvalContext::Storage *storage, unsigned offset, VmType type)
{
	unsigned size = type.size;

	char *value = (char*)ctx.allocator->alloc(size);
	memset(value, 0, size);

	if(!storage->Reserve(ctx, offset, size))
		return (VmConstant*)Report(ctx, "ERROR: out of stack space");

	memcpy(value, storage->data.data + offset, size);

	VmConstant *result = new (ctx.get<VmConstant>()) VmConstant(ctx.allocator, type, NULL);

	result->sValue = value;

	return result;
}